

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntermTraverse.cpp
# Opt level: O0

void __thiscall glslang::TIntermAggregate::traverse(TIntermAggregate *this,TIntermTraverser *it)

{
  TIntermNode *pTVar1;
  bool bVar2;
  int iVar3;
  reference ppTVar4;
  reference ppTVar5;
  reference ppTVar6;
  __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
  local_48;
  __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
  local_40;
  iterator sit_1;
  undefined1 local_30 [16];
  reverse_iterator sit;
  bool visit;
  TIntermTraverser *it_local;
  TIntermAggregate *this_local;
  
  sit.current._M_current._7_1_ = 1;
  if ((it->preVisit & 1U) != 0) {
    iVar3 = (*it->_vptr_TIntermTraverser[7])(it,0,this);
    sit.current._M_current._7_1_ = (byte)iVar3 & 1;
  }
  if (sit.current._M_current._7_1_ != 0) {
    TIntermTraverser::incrementDepth(it,(TIntermNode *)this);
    if ((it->rightToLeft & 1U) == 0) {
      local_40._M_current =
           (TIntermNode **)
           std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::begin
                     (&(this->sequence).
                       super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>);
      while( true ) {
        local_48._M_current =
             (TIntermNode **)
             std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::end
                       (&(this->sequence).
                         super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>);
        bVar2 = __gnu_cxx::operator!=(&local_40,&local_48);
        if (!bVar2) break;
        ppTVar6 = __gnu_cxx::
                  __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                  ::operator*(&local_40);
        (*(*ppTVar6)->_vptr_TIntermNode[2])();
        if (((sit.current._M_current._7_1_ & 1) != 0) && ((it->inVisit & 1U) != 0)) {
          ppTVar6 = __gnu_cxx::
                    __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                    ::operator*(&local_40);
          pTVar1 = *ppTVar6;
          ppTVar5 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::back
                              (&(this->sequence).
                                super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>
                              );
          if (pTVar1 != *ppTVar5) {
            iVar3 = (*it->_vptr_TIntermTraverser[7])(it,1,this);
            sit.current._M_current._7_1_ = (byte)iVar3 & 1;
          }
        }
        __gnu_cxx::
        __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
        ::operator++(&local_40,0);
      }
    }
    else {
      std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::rbegin
                ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)(local_30 + 8));
      while( true ) {
        std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::rend
                  ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)local_30);
        bVar2 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>_>
                                 *)(local_30 + 8),
                                (reverse_iterator<__gnu_cxx::__normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>_>
                                 *)local_30);
        if (!bVar2) break;
        ppTVar4 = std::
                  reverse_iterator<__gnu_cxx::__normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>_>
                  ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>_>
                               *)(local_30 + 8));
        (*(*ppTVar4)->_vptr_TIntermNode[2])(*ppTVar4,it);
        if (((sit.current._M_current._7_1_ & 1) != 0) && ((it->inVisit & 1U) != 0)) {
          ppTVar4 = std::
                    reverse_iterator<__gnu_cxx::__normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>_>
                    ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>_>
                                 *)(local_30 + 8));
          pTVar1 = *ppTVar4;
          ppTVar5 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::front
                              (&(this->sequence).
                                super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>
                              );
          if (pTVar1 != *ppTVar5) {
            iVar3 = (*it->_vptr_TIntermTraverser[7])(it,1,this);
            sit.current._M_current._7_1_ = (byte)iVar3 & 1;
          }
        }
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>_>
        ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>_>
                      *)&sit_1,(int)local_30 + 8);
      }
    }
    TIntermTraverser::decrementDepth(it);
  }
  if (((sit.current._M_current._7_1_ & 1) != 0) && ((it->postVisit & 1U) != 0)) {
    (*it->_vptr_TIntermTraverser[7])(it,2,this);
  }
  return;
}

Assistant:

void TIntermAggregate::traverse(TIntermTraverser *it)
{
    bool visit = true;

    if (it->preVisit)
        visit = it->visitAggregate(EvPreVisit, this);

    if (visit) {
        it->incrementDepth(this);

        if (it->rightToLeft) {
            for (TIntermSequence::reverse_iterator sit = sequence.rbegin(); sit != sequence.rend(); sit++) {
                (*sit)->traverse(it);

                if (visit && it->inVisit) {
                    if (*sit != sequence.front())
                        visit = it->visitAggregate(EvInVisit, this);
                }
            }
        } else {
            for (TIntermSequence::iterator sit = sequence.begin(); sit != sequence.end(); sit++) {
                (*sit)->traverse(it);

                if (visit && it->inVisit) {
                    if (*sit != sequence.back())
                        visit = it->visitAggregate(EvInVisit, this);
                }
            }
        }

        it->decrementDepth();
    }

    if (visit && it->postVisit)
        it->visitAggregate(EvPostVisit, this);
}